

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::Capturer::Capturer
          (Capturer *this,StringRef macroName,SourceLineInfo *lineInfo,OfType resultType,
          StringRef names)

{
  Capturer *pCVar1;
  int iVar2;
  IResultCapture *pIVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  byte *pbVar9;
  bool bVar10;
  char c;
  stack<char,_std::deque<char,_std::allocator<char>_>_> openings;
  byte local_f5;
  OfType local_f4;
  Capturer *local_f0;
  string local_e8;
  SourceLineInfo *local_c8;
  char *local_c0;
  StringRef local_b8;
  _Deque_base<char,_std::allocator<char>_> local_a8;
  ReusableStringStream local_58;
  SourceLineInfo local_40;
  
  local_b8.m_size = macroName.m_size;
  local_b8.m_start = macroName.m_start;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f4 = resultType;
  local_f0 = this;
  local_c8 = lineInfo;
  pIVar3 = getResultCapture();
  this->m_resultCapture = pIVar3;
  this->m_captured = 0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  clara::std::_Deque_base<char,_std::allocator<char>_>::_M_initialize_map(&local_a8,0);
  if (names.m_size == 0) {
    uVar8 = 0;
  }
  else {
    uVar7 = 0;
    uVar8 = 0;
    do {
      local_f5 = names.m_start[uVar7];
      if (local_f5 < 0x5b) {
        switch(local_f5) {
        case 0x22:
        case 0x27:
          uVar6 = uVar7 + 1;
          if (names.m_size <= uVar6) {
LAB_00128a42:
            ReusableStringStream::ReusableStringStream(&local_58);
            local_40.file =
                 "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/catch2/catch.hpp"
            ;
            local_40.line = 0x2e6d;
            Catch::operator<<(local_58.m_oss,&local_40);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_58.m_oss,": Internal Catch2 error: ",0x19);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_58.m_oss,"CAPTURE parsing encountered unmatched quote",0x2b);
            std::__cxx11::stringbuf::str();
            throw_logic_error(&local_e8);
          }
          bVar10 = true;
          bVar5 = names.m_start[uVar6];
          while (bVar5 != local_f5) {
            uVar4 = uVar6;
            if (bVar5 == 0x5c) {
              uVar4 = uVar7 + 2;
            }
            uVar6 = uVar4 + 1;
            bVar10 = uVar6 < names.m_size;
            if (!bVar10) goto LAB_00128a42;
            uVar7 = uVar4;
            bVar5 = names.m_start[uVar6];
          }
          uVar7 = uVar6;
          if (!bVar10) goto LAB_00128a42;
          break;
        case 0x28:
          goto switchD_001286ed_caseD_28;
        case 0x29:
          goto switchD_001286ed_caseD_29;
        case 0x2c:
          if ((uVar8 != uVar7) &&
             (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_a8._M_impl.super__Deque_impl_data._M_start._M_cur)) {
            std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
            emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
                      ((vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>> *)this,
                       &local_b8,local_c8,&local_f4);
            if (names.m_size <= uVar8) goto LAB_001289a0;
            uVar6 = (uVar7 - uVar8) + 1;
            while (((byte)names.m_start[uVar8] == 0x2c ||
                   (iVar2 = isspace((uint)(byte)names.m_start[uVar8]), iVar2 != 0))) {
              uVar8 = uVar8 + 1;
              uVar6 = uVar6 - 1;
              if (uVar8 == names.m_size) goto LAB_001289a0;
            }
            local_c0 = names.m_start + uVar8;
            uVar4 = uVar7;
            while (((byte)names.m_start[uVar4] == 0x2c ||
                   (iVar2 = isspace((uint)(byte)names.m_start[uVar4]), iVar2 != 0))) {
              uVar4 = uVar4 - 1;
              uVar6 = uVar6 - 1;
              if (names.m_size <= uVar4) goto LAB_001289a0;
            }
            uVar4 = names.m_size - uVar8;
            if (uVar6 <= names.m_size - uVar8) {
              uVar4 = uVar6;
            }
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e8,local_c0,local_c0 + uVar4);
            this = local_f0;
            std::__cxx11::string::operator=
                      ((string *)
                       &(local_f0->m_messages).
                        super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].message,(string *)&local_e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append
                      ((char *)&(this->m_messages).
                                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1].message);
            uVar8 = uVar7;
          }
        }
      }
      else {
        if (local_f5 < 0x7b) {
          if (local_f5 != 0x5b) {
            if (local_f5 != 0x5d) goto switchD_001286ed_caseD_23;
switchD_001286ed_caseD_29:
            if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              operator_delete(local_a8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   (_Elt_pointer)
                   ((byte *)local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x200);
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   (_Elt_pointer)
                   ((byte *)local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1ff);
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_a8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            goto switchD_001286ed_caseD_23;
          }
        }
        else {
          if (local_f5 == 0x7d) goto switchD_001286ed_caseD_29;
          if (local_f5 != 0x7b) goto switchD_001286ed_caseD_23;
        }
switchD_001286ed_caseD_28:
        if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<char,std::allocator<char>>::_M_push_back_aux<char_const&>
                    ((deque<char,std::allocator<char>> *)&local_a8,(char *)&local_f5);
        }
        else {
          *local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_f5;
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
switchD_001286ed_caseD_23:
      uVar7 = uVar7 + 1;
    } while (uVar7 < names.m_size);
  }
  if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    __assert_fail("openings.empty() && \"Mismatched openings\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/catch2/catch.hpp"
                  ,0x2e90,
                  "Catch::Capturer::Capturer(StringRef, const SourceLineInfo &, ResultWas::OfType, StringRef)"
                 );
  }
  std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
  emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
            ((vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>> *)this,&local_b8,
             local_c8,&local_f4);
  uVar7 = names.m_size - uVar8;
  if (uVar8 <= names.m_size && uVar7 != 0) {
    uVar6 = names.m_size - 1;
    pbVar9 = (byte *)(names.m_start + uVar8);
    do {
      if ((*pbVar9 != 0x2c) && (iVar2 = isspace((uint)*pbVar9), uVar8 = uVar7, iVar2 == 0))
      goto LAB_00128981;
      pbVar9 = pbVar9 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
LAB_001289a0:
  __assert_fail("index < m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/catch2/catch.hpp"
                ,0x283,"char Catch::StringRef::operator[](size_type) const");
LAB_00128981:
  do {
    if (((byte)names.m_start[uVar6] != 0x2c) &&
       (iVar2 = isspace((uint)(byte)names.m_start[uVar6]), iVar2 == 0)) {
      if (uVar7 < uVar8) {
        uVar8 = uVar7;
      }
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,pbVar9,pbVar9 + uVar8);
      pCVar1 = local_f0;
      std::__cxx11::string::operator=
                ((string *)
                 &(local_f0->m_messages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1].message,(string *)&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append
                ((char *)&(pCVar1->m_messages).
                          super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].message);
      clara::std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_a8);
      return;
    }
    uVar6 = uVar6 - 1;
    uVar8 = uVar8 - 1;
  } while (uVar6 < names.m_size);
  goto LAB_001289a0;
}

Assistant:

Capturer::Capturer( StringRef macroName, SourceLineInfo const& lineInfo, ResultWas::OfType resultType, StringRef names ) {
        auto trimmed = [&] (size_t start, size_t end) {
            while (names[start] == ',' || isspace(static_cast<unsigned char>(names[start]))) {
                ++start;
            }
            while (names[end] == ',' || isspace(static_cast<unsigned char>(names[end]))) {
                --end;
            }
            return names.substr(start, end - start + 1);
        };
        auto skipq = [&] (size_t start, char quote) {
            for (auto i = start + 1; i < names.size() ; ++i) {
                if (names[i] == quote)
                    return i;
                if (names[i] == '\\')
                    ++i;
            }
            CATCH_INTERNAL_ERROR("CAPTURE parsing encountered unmatched quote");
        };

        size_t start = 0;
        std::stack<char> openings;
        for (size_t pos = 0; pos < names.size(); ++pos) {
            char c = names[pos];
            switch (c) {
            case '[':
            case '{':
            case '(':
            // It is basically impossible to disambiguate between
            // comparison and start of template args in this context
//            case '<':
                openings.push(c);
                break;
            case ']':
            case '}':
            case ')':
//           case '>':
                openings.pop();
                break;
            case '"':
            case '\'':
                pos = skipq(pos, c);
                break;
            case ',':
                if (start != pos && openings.empty()) {
                    m_messages.emplace_back(macroName, lineInfo, resultType);
                    m_messages.back().message = static_cast<std::string>(trimmed(start, pos));
                    m_messages.back().message += " := ";
                    start = pos;
                }
            }
        }
        assert(openings.empty() && "Mismatched openings");
        m_messages.emplace_back(macroName, lineInfo, resultType);
        m_messages.back().message = static_cast<std::string>(trimmed(start, names.size() - 1));
        m_messages.back().message += " := ";
    }